

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall llvm::SmallPtrSetImplBase::Grow(SmallPtrSetImplBase *this,uint NewSize)

{
  void **__ptr;
  void *Ptr;
  bool bVar1;
  void **ppvVar2;
  void **ppvVar3;
  void *pvVar4;
  void *Elt;
  void **BucketPtr;
  void **NewBuckets;
  bool WasSmall;
  void **OldEnd;
  void **OldBuckets;
  uint NewSize_local;
  SmallPtrSetImplBase *this_local;
  
  __ptr = this->CurArray;
  ppvVar2 = EndPointer(this);
  bVar1 = isSmall(this);
  ppvVar3 = (void **)safe_malloc((ulong)NewSize << 3);
  this->CurArray = ppvVar3;
  this->CurArraySize = NewSize;
  memset(this->CurArray,0xff,(ulong)NewSize << 3);
  for (Elt = __ptr; (void **)Elt != ppvVar2; Elt = (void *)((long)Elt + 8)) {
    Ptr = *Elt;
    pvVar4 = getTombstoneMarker();
    if (Ptr != pvVar4) {
      pvVar4 = getEmptyMarker();
      if (Ptr != pvVar4) {
        ppvVar3 = FindBucketFor(this,Ptr);
        *ppvVar3 = Ptr;
      }
    }
  }
  if (!bVar1) {
    free(__ptr);
  }
  this->NumNonEmpty = this->NumNonEmpty - this->NumTombstones;
  this->NumTombstones = 0;
  return;
}

Assistant:

void SmallPtrSetImplBase::Grow(unsigned NewSize) {
  const void **OldBuckets = CurArray;
  const void **OldEnd = EndPointer();
  bool WasSmall = isSmall();

  // Install the new array.  Clear all the buckets to empty.
  const void **NewBuckets = (const void**) safe_malloc(sizeof(void*) * NewSize);

  // Reset member only if memory was allocated successfully
  CurArray = NewBuckets;
  CurArraySize = NewSize;
  memset(CurArray, -1, NewSize*sizeof(void*));

  // Copy over all valid entries.
  for (const void **BucketPtr = OldBuckets; BucketPtr != OldEnd; ++BucketPtr) {
    // Copy over the element if it is valid.
    const void *Elt = *BucketPtr;
    if (Elt != getTombstoneMarker() && Elt != getEmptyMarker())
      *const_cast<void**>(FindBucketFor(Elt)) = const_cast<void*>(Elt);
  }

  if (!WasSmall)
    free(OldBuckets);
  NumNonEmpty -= NumTombstones;
  NumTombstones = 0;
}